

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O2

void __thiscall FParser::PointlessBrackets(FParser *this,int *start,int *stop)

{
  long lVar1;
  int iVar2;
  
  do {
    lVar1 = (long)*start;
    if ((*this->Tokens[lVar1] != '(') || (*this->Tokens[*stop] != ')')) {
      return;
    }
    iVar2 = 0;
    for (; lVar1 < *stop; lVar1 = lVar1 + 1) {
      if ((this->TokenType[lVar1] == operator_) &&
         (iVar2 = (iVar2 + (uint)(*this->Tokens[lVar1] == '(')) -
                  (uint)(*this->Tokens[lVar1] == ')'), iVar2 == 0)) {
        return;
      }
    }
    *start = *start + 1;
    *stop = *stop + -1;
  } while( true );
}

Assistant:

void FParser::PointlessBrackets(int *start, int *stop)
{
	int bracket_level, i;
	
	// check that the start and end are brackets
	
	while(Tokens[*start][0] == '(' && Tokens[*stop][0] == ')')
    {
		
		bracket_level = 0;
		
		// confirm there are pointless brackets..
		// if they are, bracket_level will only get to 0
		// at the last token
		// check up to <*stop rather than <=*stop to ignore
		// the last token
		
		for(i = *start; i<*stop; i++)
		{
			if(TokenType[i] != operator_) continue; // ops only
			bracket_level += (Tokens[i][0] == '(');
			bracket_level -= (Tokens[i][0] == ')');
			if(bracket_level == 0) return; // stop if braces stop before end
		}
		
		// move both brackets in
		
		*start = *start + 1;
		*stop = *stop - 1;
    }
}